

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O1

void sylvan_set_sizes(size_t min_tablesize,size_t max_tablesize,size_t min_cachesize,
                     size_t max_cachesize)

{
  if (max_tablesize <= min_tablesize) {
    min_tablesize = max_tablesize;
  }
  if (max_cachesize <= min_cachesize) {
    min_cachesize = max_cachesize;
  }
  if (((((int)POPCOUNT(min_tablesize) == 1) && ((int)POPCOUNT(max_tablesize) == 1)) &&
      ((int)POPCOUNT(min_cachesize) == 1)) && ((int)POPCOUNT(max_cachesize) == 1)) {
    if (max_tablesize < 0x40000000001) {
      table_min = min_tablesize;
      table_max = max_tablesize;
      cache_min = min_cachesize;
      cache_max = max_cachesize;
      return;
    }
  }
  else {
    sylvan_set_sizes_cold_1();
  }
  sylvan_set_sizes_cold_2();
}

Assistant:

void
sylvan_set_sizes(size_t min_tablesize, size_t max_tablesize, size_t min_cachesize, size_t max_cachesize)
{
    /* Some sanity checks */
    if (min_tablesize > max_tablesize) min_tablesize = max_tablesize;
    if (min_cachesize > max_cachesize) min_cachesize = max_cachesize;

    if (!is_power_of_two(min_tablesize) || !is_power_of_two(max_tablesize) ||
        !is_power_of_two(min_cachesize) || !is_power_of_two(max_cachesize)) {
        fprintf(stderr, "sylvan_set_sizes error: parameters not powers of 2!\n");
        exit(1);
    }

    if (max_tablesize > 0x0000040000000000) {
        fprintf(stderr, "sylvan_set_sizes error: tablesize must be <= 42 bits!\n");
        exit(1);
    }

    table_min = min_tablesize;
    table_max = max_tablesize;
    cache_min = min_cachesize;
    cache_max = max_cachesize;
}